

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O2

int curl_formget(curl_httppost *form,void *arg,curl_formget_callback append)

{
  CURLcode CVar1;
  size_t sVar2;
  size_t sVar3;
  FormData *pFVar4;
  FormData *data;
  Form temp;
  curl_off_t size;
  char buffer [8192];
  
  pFVar4 = (FormData *)&data;
  CVar1 = Curl_getformdata((SessionHandle *)0x0,&data,form,(char *)0x0,&size);
  if (CVar1 == CURLE_OK) {
    do {
      while( true ) {
        pFVar4 = pFVar4->next;
        if (pFVar4 == (FormData *)0x0) {
          Curl_formclean(&data);
          return 0;
        }
        if ((pFVar4->type & ~FORM_CONTENT) != FORM_CALLBACK) break;
        temp.sent = 0;
        temp.fp = (FILE *)0x0;
        temp.fread_func = (curl_read_callback)0x0;
        temp.data = pFVar4;
        do {
          sVar2 = readfromfile(&temp,buffer,0x2000);
          if ((0x2000 < sVar2) || (sVar3 = (*append)(arg,buffer,sVar2), sVar2 != sVar3)) {
            if (temp.fp != (FILE *)0x0) {
              fclose((FILE *)temp.fp);
            }
            goto LAB_0045ff52;
          }
        } while (sVar2 != 0);
      }
      sVar2 = pFVar4->length;
      sVar3 = (*append)(arg,pFVar4->line,sVar2);
    } while (sVar2 == sVar3);
LAB_0045ff52:
    Curl_formclean(&data);
    CVar1 = ~CURLE_OK;
  }
  return CVar1;
}

Assistant:

int curl_formget(struct curl_httppost *form, void *arg,
                 curl_formget_callback append)
{
  CURLcode result;
  curl_off_t size;
  struct FormData *data, *ptr;

  result = Curl_getformdata(NULL, &data, form, NULL, &size);
  if(result)
    return (int)result;

  for(ptr = data; ptr; ptr = ptr->next) {
    if((ptr->type == FORM_FILE) || (ptr->type == FORM_CALLBACK)) {
      char buffer[8192];
      size_t nread;
      struct Form temp;

      Curl_FormInit(&temp, ptr);

      do {
        nread = readfromfile(&temp, buffer, sizeof(buffer));
        if((nread == (size_t) -1) ||
           (nread > sizeof(buffer)) ||
           (nread != append(arg, buffer, nread))) {
          if(temp.fp)
            fclose(temp.fp);
          Curl_formclean(&data);
          return -1;
        }
      } while(nread);
    }
    else {
      if(ptr->length != append(arg, ptr->line, ptr->length)) {
        Curl_formclean(&data);
        return -1;
      }
    }
  }
  Curl_formclean(&data);
  return 0;
}